

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

bool __thiscall
wasm::anon_unknown_0::RecGroupEquator::eq(RecGroupEquator *this,HeapType a,HeapType b)

{
  bool bVar1;
  ulong in_RCX;
  RecGroupEquator *pRVar2;
  RecGroupEquator *pRVar3;
  
  if (0xd < in_RCX && 0xd < b.id) {
    if (*(long *)(b.id + 0x18) == *(long *)(in_RCX + 0x18)) {
      pRVar3 = (RecGroupEquator *)(b.id | 1);
      if (*(RecGroupEquator **)(b.id + 0x10) != (RecGroupEquator *)0x0) {
        pRVar3 = *(RecGroupEquator **)(b.id + 0x10);
      }
      pRVar2 = (RecGroupEquator *)(in_RCX | 1);
      if (*(RecGroupEquator **)(in_RCX + 0x10) != (RecGroupEquator *)0x0) {
        pRVar2 = *(RecGroupEquator **)(in_RCX + 0x10);
      }
      bVar1 = pRVar2 == (RecGroupEquator *)a.id;
      if (pRVar3 != this) {
        bVar1 = pRVar3 == pRVar2 && pRVar2 != (RecGroupEquator *)a.id;
      }
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return b.id == in_RCX;
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }